

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitMemberAccessExpression
          (SyntaxDumper *this,MemberAccessExpressionSyntax *node)

{
  ExpressionSyntax *pEVar1;
  IdentifierNameSyntax *pIVar2;
  MemberAccessExpressionSyntax local_50 [56];
  MemberAccessExpressionSyntax *local_18;
  MemberAccessExpressionSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (MemberAccessExpressionSyntax *)this;
  traverseExpression(this,(ExpressionSyntax *)node);
  pEVar1 = MemberAccessExpressionSyntax::expression(local_18);
  (**(code **)(*(long *)this + 0x2f0))(this,pEVar1);
  MemberAccessExpressionSyntax::operatorToken(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  pIVar2 = MemberAccessExpressionSyntax::memberName(local_18);
  (**(code **)(*(long *)this + 0x2f0))(this,pIVar2);
  return Skip;
}

Assistant:

virtual Action visitMemberAccessExpression(const MemberAccessExpressionSyntax* node) override
    {
        traverseExpression(node);
        nonterminal(node->expression());
        terminal(node->operatorToken(), node);
        nonterminal(node->memberName());
        return Action::Skip;
    }